

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O2

int secp256k1_rangeproof_sign
              (secp256k1_context *ctx,uchar *proof,size_t *plen,uint64_t min_value,
              secp256k1_pedersen_commitment *commit,uchar *blind,uchar *nonce,int exp,int min_bits,
              uint64_t value,uchar *message,size_t msg_len,uchar *extra_commit,
              size_t extra_commit_len,secp256k1_generator *gen)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  uchar uVar7;
  uint uVar8;
  uchar *puVar9;
  ulong uVar10;
  ulong uVar11;
  int iVar12;
  void *pvVar13;
  byte bVar14;
  ulong uVar15;
  char *pcVar16;
  uint uVar17;
  ulong len;
  ulong uVar18;
  ulong rings;
  ulong uVar19;
  secp256k1_scalar *psVar20;
  size_t sVar21;
  bool bVar22;
  int overflow;
  secp256k1_context *local_6c50;
  size_t *local_6c48;
  uchar *local_6c40;
  ulong local_6c38;
  ulong local_6c30;
  uchar tmpc [33];
  uchar tmp [33];
  secp256k1_ge genp;
  secp256k1_sha256 local_6b78;
  secp256k1_ge commitp;
  secp256k1_scalar stmp;
  size_t rsizes [32];
  size_t secidx [32];
  secp256k1_ge local_6890;
  secp256k1_scalar sec [32];
  secp256k1_scalar k [32];
  uchar local_6038 [4096];
  secp256k1_scalar s [128];
  secp256k1_gej pubs [128];
  
  if (proof == (uchar *)0x0) {
    pvVar13 = (ctx->illegal_callback).data;
    pcVar16 = "proof != NULL";
  }
  else if (plen == (size_t *)0x0) {
    pvVar13 = (ctx->illegal_callback).data;
    pcVar16 = "plen != NULL";
  }
  else if (commit == (secp256k1_pedersen_commitment *)0x0) {
    pvVar13 = (ctx->illegal_callback).data;
    pcVar16 = "commit != NULL";
  }
  else if (blind == (uchar *)0x0) {
    pvVar13 = (ctx->illegal_callback).data;
    pcVar16 = "blind != NULL";
  }
  else if (nonce == (uchar *)0x0) {
    pvVar13 = (ctx->illegal_callback).data;
    pcVar16 = "nonce != NULL";
  }
  else if (msg_len == 0 || message != (uchar *)0x0) {
    if (extra_commit_len == 0 || extra_commit != (uchar *)0x0) {
      if (gen == (secp256k1_generator *)0x0) {
        pvVar13 = (ctx->illegal_callback).data;
        pcVar16 = "gen != NULL";
      }
      else {
        if ((ctx->ecmult_gen_ctx).built != 0) {
          secp256k1_pedersen_commitment_load(&commitp,commit);
          secp256k1_generator_load(&genp,gen);
          if (*plen < 0x41) {
            return 0;
          }
          if (exp - 0x13U < 0xffffffec) {
            return 0;
          }
          if (0x40 < (uint)min_bits) {
            return 0;
          }
          uVar11 = value - min_value;
          if (value < min_value) {
            return 0;
          }
          secidx[0] = 0;
          rsizes[0] = 1;
          len = 1;
          if (exp < 0 || min_value == 0xffffffffffffffff) {
            uVar11 = 0;
            uVar7 = 0xff;
            lVar5 = 2;
            iVar12 = 0;
            bVar22 = false;
            rings = len;
            uVar19 = len;
            bVar14 = 0;
          }
          else {
            if (0x7ffffffffffffffe < min_value) {
              return 0;
            }
            if (min_value != 0 && (long)value < 0) {
              return 0;
            }
            if (min_value == 0) {
              uVar17 = 0x40;
            }
            else {
              lVar5 = 0x3f;
              if (min_value != 0) {
                for (; min_value >> lVar5 == 0; lVar5 = lVar5 + -1) {
                }
              }
              uVar17 = (uint)lVar5 ^ 0x3f;
            }
            if ((uint)min_bits <= uVar17) {
              uVar17 = min_bits;
            }
            iVar12 = 0;
            uVar19 = 0;
            if (min_bits != 0) {
              uVar19 = 0xffffffffffffffff >> (-(char)uVar17 & 0x3fU);
            }
            for (; (iVar12 < exp && (uVar17 < 0x3e && -1 < (long)value) &&
                   (uVar19 < 0x199999999999999a)); uVar19 = uVar19 * 10) {
              uVar11 = uVar11 / 10;
              iVar12 = iVar12 + 1;
            }
            uVar19 = 1;
            uVar15 = uVar11;
            iVar4 = iVar12;
            while (bVar22 = iVar4 != 0, iVar4 = iVar4 + -1, bVar22) {
              uVar15 = uVar15 * 10;
              uVar19 = uVar19 * 10;
            }
            lVar5 = 0x3f;
            if (uVar11 != 0) {
              for (; uVar11 >> lVar5 == 0; lVar5 = lVar5 + -1) {
              }
            }
            uVar8 = 1;
            if (uVar11 != 0) {
              uVar8 = ((uint)lVar5 ^ 0xffffffc0) + 0x41;
            }
            if ((int)uVar8 < (int)uVar17) {
              uVar8 = uVar17;
            }
            rings = (ulong)(uVar8 + 1 >> 1);
            lVar5 = 0;
            for (uVar18 = 0; uVar18 != rings; uVar18 = uVar18 + 1) {
              uVar10 = (ulong)((uint)(uVar18 < rings - 1) | ~uVar8 & 1);
              rsizes[uVar18] = uVar10 * 2 + 2;
              lVar5 = lVar5 + uVar10 * 2 + 2;
              secidx[uVar18] = (ulong)((uint)(uVar11 >> ((char)uVar18 * '\x02' & 0x3fU)) & 3);
            }
            value = value - uVar15;
            uVar7 = (char)uVar8 + 0xff;
            bVar22 = 1 < rsizes[0];
            bVar14 = 0;
            if (bVar22) {
              bVar14 = (byte)iVar12 | 0x40;
            }
          }
          *proof = (value != 0) << 5 | bVar14;
          if (bVar22) {
            proof[1] = uVar7;
            len = 2;
          }
          if (value != 0) {
            puVar9 = proof + len;
            for (lVar6 = 0x38; lVar6 != -8; lVar6 = lVar6 + -8) {
              *puVar9 = (uchar)(value >> ((byte)lVar6 & 0x3f));
              puVar9 = puVar9 + 1;
            }
            len = len | 8;
          }
          if ((msg_len != 0) && (rings * 0x80 - 0x80 < msg_len)) {
            return 0;
          }
          local_6c38 = (ulong)((int)rings + 6U >> 3);
          if (*plen - len < (lVar5 + rings) * 0x20 + local_6c38) {
            return 0;
          }
          local_6b78.s[0] = 0x6a09e667;
          local_6b78.s[1] = 0xbb67ae85;
          local_6b78.s[2] = 0x3c6ef372;
          local_6b78.s[3] = 0xa54ff53a;
          local_6b78.s[4] = 0x510e527f;
          local_6b78.s[5] = 0x9b05688c;
          local_6b78.s[6] = 0x1f83d9ab;
          local_6b78.s[7] = 0x5be0cd19;
          local_6b78.bytes = 0;
          local_6c50 = ctx;
          local_6c48 = plen;
          secp256k1_rangeproof_serialize_point(tmp,&commitp);
          secp256k1_sha256_write(&local_6b78,tmp,0x21);
          secp256k1_rangeproof_serialize_point(tmp,&genp);
          secp256k1_sha256_write(&local_6b78,tmp,0x21);
          secp256k1_sha256_write(&local_6b78,proof,len);
          memset(local_6038,0,0x1000);
          if (message != (uchar *)0x0) {
            memcpy(local_6038,message,msg_len);
          }
          uVar15 = rings - 1;
          uVar18 = stmp.d[rings + 3];
          if (1 < uVar18) {
            uVar10 = (ulong)(rsizes[rings + 0x1f] == uVar18 - 1);
            puVar9 = local_6038 + (uVar18 - uVar10) * 0x20 + rings * 0x80 + -0x88;
            for (lVar5 = 0x38; lVar5 != -8; lVar5 = lVar5 + -8) {
              uVar7 = (uchar)(uVar11 >> ((byte)lVar5 & 0x3f));
              *puVar9 = uVar7;
              puVar9[-8] = uVar7;
              puVar9[-0x10] = uVar7;
              puVar9[-0x18] = '\0';
              puVar9 = puVar9 + 1;
            }
            local_6038[((uVar18 - 1) - uVar10) * 0x20 + uVar15 * 0x80] = 0x80;
          }
          iVar4 = secp256k1_rangeproof_genrand
                            (sec,s,local_6038,rsizes,rings,nonce,&commitp,proof,len,&genp);
          if (iVar4 == 0) {
            return 0;
          }
          memset(local_6038,0,0x1000);
          for (lVar5 = 0; rings * 4 - lVar5 != 0; lVar5 = lVar5 + 4) {
            lVar6 = *(long *)((long)secidx + lVar5 * 2) + lVar5;
            uVar1 = s[lVar6].d[1];
            uVar2 = s[lVar6].d[2];
            uVar3 = s[lVar6].d[3];
            k[0].d[lVar5] = s[lVar6].d[0];
            k[0].d[lVar5 + 1] = uVar1;
            k[0].d[lVar5 + 2] = uVar2;
            k[0].d[lVar5 + 3] = uVar3;
            s[lVar6].d[0] = 0;
            s[lVar6].d[1] = 0;
            s[lVar6].d[2] = 0;
            s[lVar6].d[3] = 0;
          }
          secp256k1_scalar_set_b32(&stmp,blind,&overflow);
          psVar20 = sec + uVar15;
          secp256k1_scalar_add(psVar20,psVar20,&stmp);
          if (overflow != 0) {
            return 0;
          }
          local_6c30 = uVar15;
          iVar4 = secp256k1_scalar_is_zero(psVar20);
          if (iVar4 != 0) {
            return 0;
          }
          local_6c40 = proof + len;
          for (uVar11 = 0; local_6c38 != uVar11; uVar11 = uVar11 + 1) {
            local_6c40[uVar11] = '\0';
          }
          sVar21 = len + local_6c38;
          lVar5 = 0;
          for (uVar11 = 0; uVar11 != rings; uVar11 = uVar11 + 1) {
            secp256k1_pedersen_ecmult
                      (&local_6c50->ecmult_gen_ctx,pubs + lVar5,sec + uVar11,
                       secidx[uVar11] * uVar19 << ((byte)uVar11 * '\x02' & 0x3f),&genp);
            if (pubs[lVar5].infinity != 0) {
              return 0;
            }
            if (uVar11 < local_6c30) {
              secp256k1_ge_set_gej_var(&local_6890,pubs + lVar5);
              secp256k1_rangeproof_serialize_point(tmpc,&local_6890);
              uVar7 = tmpc[0];
              secp256k1_sha256_write(&local_6b78,tmpc,0x21);
              local_6c40[uVar11 >> 3] = local_6c40[uVar11 >> 3] | uVar7 << ((byte)uVar11 & 7);
              *(undefined8 *)(proof + sVar21 + 0x10) = tmpc._17_8_;
              *(undefined8 *)(proof + sVar21 + 0x10 + 8) = tmpc._25_8_;
              *(undefined8 *)(proof + sVar21) = tmpc._1_8_;
              *(undefined8 *)(proof + sVar21 + 8) = tmpc._9_8_;
              sVar21 = sVar21 + 0x20;
            }
            lVar5 = lVar5 + rsizes[uVar11];
          }
          secp256k1_rangeproof_pub_expand(pubs,iVar12,rsizes,rings,&genp);
          if (extra_commit != (uchar *)0x0) {
            secp256k1_sha256_write(&local_6b78,extra_commit,extra_commit_len);
          }
          secp256k1_sha256_finalize(&local_6b78,tmp);
          psVar20 = s;
          iVar12 = secp256k1_borromean_sign
                             (&local_6c50->ecmult_gen_ctx,proof + sVar21,psVar20,pubs,k,sec,rsizes,
                              secidx,rings,tmp,0x20);
          if (iVar12 == 0) {
            return 0;
          }
          while( true ) {
            sVar21 = sVar21 + 0x20;
            bVar22 = lVar5 == 0;
            lVar5 = lVar5 + -1;
            if (bVar22) break;
            secp256k1_scalar_get_b32(proof + sVar21,psVar20);
            psVar20 = psVar20 + 1;
          }
          *local_6c48 = sVar21;
          return 1;
        }
        pvVar13 = (ctx->illegal_callback).data;
        pcVar16 = "secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx)";
      }
    }
    else {
      pvVar13 = (ctx->illegal_callback).data;
      pcVar16 = "extra_commit != NULL || extra_commit_len == 0";
    }
  }
  else {
    pvVar13 = (ctx->illegal_callback).data;
    pcVar16 = "message != NULL || msg_len == 0";
  }
  (*(ctx->illegal_callback).fn)(pcVar16,pvVar13);
  return 0;
}

Assistant:

int secp256k1_rangeproof_sign(const secp256k1_context* ctx, unsigned char *proof, size_t *plen, uint64_t min_value,
 const secp256k1_pedersen_commitment *commit, const unsigned char *blind, const unsigned char *nonce, int exp, int min_bits, uint64_t value,
 const unsigned char *message, size_t msg_len, const unsigned char *extra_commit, size_t extra_commit_len, const secp256k1_generator* gen){
    secp256k1_ge commitp;
    secp256k1_ge genp;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(plen != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(blind != NULL);
    ARG_CHECK(nonce != NULL);
    ARG_CHECK(message != NULL || msg_len == 0);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(gen != NULL);
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    secp256k1_pedersen_commitment_load(&commitp, commit);
    secp256k1_generator_load(&genp, gen);
    return secp256k1_rangeproof_sign_impl(&ctx->ecmult_gen_ctx,
     proof, plen, min_value, &commitp, blind, nonce, exp, min_bits, value, message, msg_len, extra_commit, extra_commit_len, &genp);
}